

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QSimplexConstraint_*>::growAppend
          (QCommonArrayOps<QSimplexConstraint_*> *this,QSimplexConstraint **b,QSimplexConstraint **e
          )

{
  long n;
  QSimplexConstraint **ppQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QSimplexConstraint_*> local_48;
  QSimplexConstraint **local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = (long)e - (long)b >> 3;
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QSimplexConstraint **)0x0;
    ppQVar1 = (this->super_Type).super_QArrayDataPointer<QSimplexConstraint_*>.ptr;
    if ((b < ppQVar1) ||
       (ppQVar1 + (this->super_Type).super_QArrayDataPointer<QSimplexConstraint_*>.size <= b)) {
      QArrayDataPointer<QSimplexConstraint_*>::detachAndGrow
                ((QArrayDataPointer<QSimplexConstraint_*> *)this,GrowsAtEnd,n,
                 (QSimplexConstraint ***)0x0,(QArrayDataPointer<QSimplexConstraint_*> *)0x0);
      ppQVar1 = b;
    }
    else {
      QArrayDataPointer<QSimplexConstraint_*>::detachAndGrow
                ((QArrayDataPointer<QSimplexConstraint_*> *)this,GrowsAtEnd,n,&local_28,&local_48);
      ppQVar1 = local_28;
    }
    QPodArrayOps<QSimplexConstraint_*>::copyAppend
              (&this->super_Type,ppQVar1,
               (QSimplexConstraint **)(((long)e - (long)b) + (long)ppQVar1));
    QArrayDataPointer<QSimplexConstraint_*>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }